

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_ISWAP_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = instr->src;
  if (bVar1 == instr->dst) {
    return;
  }
  this->registerUsage[instr->dst] = i;
  this->registerUsage[bVar1] = i;
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"\txchg ");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->src * 8));
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_ISWAP_R(Instruction& instr, int i) {
		if (instr.src != instr.dst) {
			registerUsage[instr.dst] = i;
			registerUsage[instr.src] = i;
			asmCode << "\txchg " << regR[instr.dst] << ", " << regR[instr.src] << std::endl;
			traceint(instr);
		}
		else {
			tracenop(instr);
		}
	}